

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reportjson.cpp
# Opt level: O0

void __thiscall
trun::ResultsReportJSON::PrintFailures
          (ResultsReportJSON *this,
          vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
          *results)

{
  bool bVar1;
  bool bVar2;
  kTestResult kVar3;
  reference psVar4;
  element_type *this_00;
  shared_ptr<trun::TestResult> local_68 [2];
  undefined1 local_48 [8];
  shared_ptr<trun::TestResult> r;
  const_iterator __end1;
  const_iterator __begin1;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *__range1;
  bool bNeedComma;
  vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
  *results_local;
  ResultsReportJSON *this_local;
  
  if (((this->bHadSuccess & 1U) != 0) || ((this->bHadSummary & 1U) != 0)) {
    fprintf((FILE *)(this->super_ResultsReportPinterBase).fout,",\n");
  }
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"\"Failures\":[");
  ResultsReportPinterBase::PushIndent(&this->super_ResultsReportPinterBase);
  bVar1 = false;
  __end1 = std::
           vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
           ::begin(results);
  r.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       std::
       vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>
       ::end(results);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                      (&__end1,(__normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
                                *)&r.
                                   super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_refcount);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
             ::operator*(&__end1);
    std::shared_ptr<trun::TestResult>::shared_ptr((shared_ptr<trun::TestResult> *)local_48,psVar4);
    this_00 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)local_48);
    kVar3 = TestResult::Result(this_00);
    if (kVar3 != kTestResult_Pass) {
      if (bVar1) {
        ResultsReportPinterBase::WriteNoIndent(&this->super_ResultsReportPinterBase,",\n");
      }
      std::shared_ptr<trun::TestResult>::shared_ptr
                (local_68,(shared_ptr<trun::TestResult> *)local_48);
      PrintTestResult(this,local_68);
      std::shared_ptr<trun::TestResult>::~shared_ptr(local_68);
      bVar1 = true;
    }
    std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_48);
    __gnu_cxx::
    __normal_iterator<const_std::shared_ptr<trun::TestResult>_*,_std::vector<std::shared_ptr<trun::TestResult>,_std::allocator<std::shared_ptr<trun::TestResult>_>_>_>
    ::operator++(&__end1);
  }
  ResultsReportPinterBase::PopIndent(&this->super_ResultsReportPinterBase);
  ResultsReportPinterBase::WriteLine(&this->super_ResultsReportPinterBase,"");
  ResultsReportPinterBase::Write(&this->super_ResultsReportPinterBase,"]");
  this->bHadFailures = true;
  return;
}

Assistant:

void ResultsReportJSON::PrintFailures(const std::vector<TestResult::Ref > &results) {
    if (bHadSuccess || bHadSummary) {
        fprintf(fout,",\n");
    }

    WriteLine("\"Failures\":[");
    PushIndent();
    bool bNeedComma = false;

    for (auto r : results) {
        if (r->Result() != kTestResult_Pass) {
            if (bNeedComma) {
                WriteNoIndent(",\n");
            }
            PrintTestResult(r);
            bNeedComma = true;
        }
    }
    PopIndent();
    WriteLine("");
    Write("]");
    bHadFailures = true;
}